

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

int __thiscall QLocalSocketPrivate::init(QLocalSocketPrivate *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  QLocalUnixSocket *pQVar2;
  long in_FS_OFFSET;
  Connection CStack_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  QObject local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&this->field_0x8;
  pQVar2 = &this->unixSocket;
  QObject::connect(local_28,(char *)pQVar2,(QObject *)"2bytesWritten(qint64)",pcVar1,0x26d18a);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect(local_30,(char *)pQVar2,(QObject *)"2readyRead()",pcVar1,0x259708);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QObject::connect(local_38,(char *)pQVar2,(QObject *)"2connected()",pcVar1,0x26d11e);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,(char *)pQVar2,(QObject *)"2disconnected()",pcVar1,0x26d142);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)pQVar2,(QObject *)"2stateChanged(QAbstractSocket::SocketState)",
                   pcVar1,0x27d49c);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,(char *)pQVar2,(QObject *)"2errorOccurred(QAbstractSocket::SocketError)"
                   ,pcVar1,0x27d4cb);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect((QObject *)&CStack_58,(char *)pQVar2,(QObject *)"2readChannelFinished()",pcVar1,
                   0x25c971);
  QMetaObject::Connection::~Connection(&CStack_58);
  QObject::setParent((QObject *)pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::init()
{
    Q_Q(QLocalSocket);
    // QIODevice signals
    q->connect(&unixSocket, SIGNAL(bytesWritten(qint64)),
               q, SIGNAL(bytesWritten(qint64)));
    q->connect(&unixSocket, SIGNAL(readyRead()), q, SIGNAL(readyRead()));
    // QAbstractSocket signals
    q->connect(&unixSocket, SIGNAL(connected()), q, SIGNAL(connected()));
    q->connect(&unixSocket, SIGNAL(disconnected()), q, SIGNAL(disconnected()));
    q->connect(&unixSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
               q, SLOT(_q_stateChanged(QAbstractSocket::SocketState)));
    q->connect(&unixSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)),
               q, SLOT(_q_errorOccurred(QAbstractSocket::SocketError)));
    q->connect(&unixSocket, SIGNAL(readChannelFinished()), q, SIGNAL(readChannelFinished()));
    unixSocket.setParent(q);
}